

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4afdb9::Db::parsePrefixExpr(Db *this,StringView Kind)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = parseExpr(this);
  if (pNVar1 == (Node *)0x0) {
    pNVar2 = (Node *)0x0;
  }
  else {
    pNVar2 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
    pNVar2->K = KExpr;
    pNVar2->RHSComponentCache = No;
    pNVar2->ArrayCache = No;
    pNVar2->FunctionCache = No;
    pNVar2->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206b58;
    pNVar2[1]._vptr_Node = (_func_int **)Kind.First;
    *(char **)&pNVar2[1].K = Kind.Last;
    pNVar2[2]._vptr_Node = (_func_int **)pNVar1;
  }
  return pNVar2;
}

Assistant:

Node *Db::parsePrefixExpr(StringView Kind) {
  Node *E = parseExpr();
  if (E == nullptr)
    return nullptr;
  return make<PrefixExpr>(Kind, E);
}